

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::insert<kj::StringPtr,kj::StringPtr>
          (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this,
          ArrayPtr<kj::StringPtr> table,size_t pos,StringPtr *params)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  ulong uVar6;
  undefined8 *in_R9;
  Maybe<unsigned_long> MVar7;
  Iterator iter;
  Iterator IStack_78;
  void *local_60;
  size_t local_58;
  SearchKey local_50;
  StringPtr *local_48;
  void **local_40;
  
  local_60 = (void *)table.size_;
  local_48 = table.ptr;
  local_40 = &local_60;
  local_50._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00224938;
  local_58 = pos;
  _::BTreeImpl::insert(&IStack_78,(BTreeImpl *)&(local_48->content).size_,&local_50);
  uVar4 = (ulong)IStack_78.row;
  if (uVar4 == 0xe) {
    uVar4 = 0xe;
  }
  else {
    uVar1 = (IStack_78.leaf)->rows[uVar4].i;
    if (uVar1 != 0) {
      uVar6 = (ulong)(uVar1 - 1);
      lVar5 = uVar6 * 0x10;
      __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
            ((long)local_60 + lVar5 + 8))->value;
      if (__n.value == in_R9[1]) {
        pvVar3 = local_60;
        if (__n.value != 0) {
          iVar2 = bcmp(*(void **)((long)local_60 + lVar5),(void *)*in_R9,__n.value);
          pvVar3 = (void *)CONCAT44(extraout_var,iVar2);
          __n = extraout_RDX;
          if (iVar2 != 0) goto LAB_0015f6c2;
        }
        *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1;
        *(ulong *)(this + 8) = uVar6;
        goto LAB_0015f6f9;
      }
    }
  }
LAB_0015f6c2:
  pvVar3 = memmove((IStack_78.leaf)->rows + uVar4 + 1,(IStack_78.leaf)->rows + uVar4,
                   (ulong)(IStack_78.row + 1) * -4 + 0x38);
  ((IStack_78.leaf)->rows + uVar4 + 1)[-1] = (MaybeUint)((int)params + 1);
  *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x0;
  __n = extraout_RDX_00;
LAB_0015f6f9:
  MVar7.ptr.field_1.value = __n.value;
  MVar7.ptr._0_8_ = pvVar3;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }